

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

void __thiscall
asmjit::_abi_1_10::CallConv::setPassedOrder
          (CallConv *this,RegGroup group,uint32_t a0,uint32_t a1,uint32_t a2,uint32_t a3,uint32_t a4
          ,uint32_t a5,uint32_t a6,uint32_t a7)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  RegGroup group_local;
  
  if (group < kPC) {
    _setPassedPacked(this,group,a3 << 0x18 | a0 | a2 << 0x10 | a1 << 8,
                     a7 << 0x18 | a4 | a6 << 0x10 | a5 << 8,0xffffffff,0xffffffff);
    uVar3 = 1 << ((byte)a0 & 0x1f);
    if (a0 == 0xff) {
      uVar3 = 0;
    }
    uVar5 = 1 << ((byte)a1 & 0x1f);
    if (a1 == 0xff) {
      uVar5 = 0;
    }
    uVar1 = 1 << ((byte)a2 & 0x1f);
    if (a2 == 0xff) {
      uVar1 = 0;
    }
    uVar7 = 1 << ((byte)a3 & 0x1f);
    if (a3 == 0xff) {
      uVar7 = 0;
    }
    uVar4 = 1 << ((byte)a4 & 0x1f);
    if (a4 == 0xff) {
      uVar4 = 0;
    }
    uVar6 = 1 << ((byte)a5 & 0x1f);
    if (a5 == 0xff) {
      uVar6 = 0;
    }
    uVar8 = 1 << ((byte)a6 & 0x1f);
    if (a6 == 0xff) {
      uVar8 = 0;
    }
    uVar9 = 1 << ((byte)a7 & 0x1f);
    if (a7 == 0xff) {
      uVar9 = 0;
    }
    puVar2 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::_abi_1_10::RegGroup>
                       (&this->_passedRegs,&group_local);
    *puVar2 = uVar9 | uVar8 | uVar6 | uVar4 | uVar7 | uVar1 | uVar5 | uVar3;
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/arm/../arm/../core/func.h"
             ,0x14b,"group <= RegGroup::kMaxVirt");
}

Assistant:

inline void setPassedOrder(RegGroup group, uint32_t a0, uint32_t a1 = 0xFF, uint32_t a2 = 0xFF, uint32_t a3 = 0xFF, uint32_t a4 = 0xFF, uint32_t a5 = 0xFF, uint32_t a6 = 0xFF, uint32_t a7 = 0xFF) noexcept {
    ASMJIT_ASSERT(group <= RegGroup::kMaxVirt);

    // NOTE: This should always be called with all arguments known at compile time, so even if it looks scary it
    // should be translated into few instructions.
    _setPassedPacked(group, Support::bytepack32_4x8(a0, a1, a2, a3),
                            Support::bytepack32_4x8(a4, a5, a6, a7),
                            0xFFFFFFFFu,
                            0xFFFFFFFFu);

    _passedRegs[group] = (a0 != 0xFF ? 1u << a0 : 0u) |
                         (a1 != 0xFF ? 1u << a1 : 0u) |
                         (a2 != 0xFF ? 1u << a2 : 0u) |
                         (a3 != 0xFF ? 1u << a3 : 0u) |
                         (a4 != 0xFF ? 1u << a4 : 0u) |
                         (a5 != 0xFF ? 1u << a5 : 0u) |
                         (a6 != 0xFF ? 1u << a6 : 0u) |
                         (a7 != 0xFF ? 1u << a7 : 0u) ;
  }